

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluUtil.cpp
# Opt level: O2

EGLenum eglu::parseClientAPI(string *api)

{
  bool bVar1;
  EGLenum EVar2;
  InternalError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  bVar1 = std::operator==(api,"OpenGL");
  EVar2 = 0x30a2;
  if (!bVar1) {
    bVar1 = std::operator==(api,"OpenGL_ES");
    EVar2 = 0x30a0;
    if (!bVar1) {
      bVar1 = std::operator==(api,"OpenVG");
      EVar2 = 0x30a1;
      if (!bVar1) {
        this = (InternalError *)__cxa_allocate_exception(0x38);
        std::operator+(&bStack_58,"Unknown EGL client API \'",api);
        std::operator+(&local_38,&bStack_58,"\'");
        tcu::InternalError::InternalError(this,&local_38);
        __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  return EVar2;
}

Assistant:

EGLenum parseClientAPI (const std::string& api)
{
	if (api == "OpenGL")
		return EGL_OPENGL_API;
	else if (api == "OpenGL_ES")
		return EGL_OPENGL_ES_API;
	else if (api == "OpenVG")
		return EGL_OPENVG_API;
	else
		throw tcu::InternalError("Unknown EGL client API '" + api + "'");
}